

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char.c++
# Opt level: O2

double __thiscall
kj::parse::_::ParseFloat::operator()
          (ParseFloat *this,Array<char> *digits,Maybe<kj::Array<char>_> *fraction,
          Maybe<kj::_::Tuple<kj::Maybe<char>,_kj::Array<char>_>_> *exponent)

{
  char *__dest;
  size_t __n;
  size_t sVar1;
  ulong count;
  char *pcVar2;
  Array<char> buf_heap;
  char buf_stack [128];
  Array<char> local_d8;
  double local_c0;
  StringPtr local_b8;
  char local_a8 [128];
  
  __n = digits->size_;
  sVar1 = __n + (fraction->ptr).field_1.value.size_ + 1;
  if ((fraction->ptr).isSet == false) {
    sVar1 = __n;
  }
  if ((exponent->ptr).isSet == true) {
    sVar1 = sVar1 + *(long *)((long)&(exponent->ptr).field_1 + 0x10) +
            (ulong)(exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value
                   .ptr.isSet + 1;
  }
  count = sVar1 + 1;
  if (count < 0x81) {
    local_d8.ptr = (char *)0x0;
    local_d8.size_ = 0;
    local_d8.disposer = (ArrayDisposer *)0x0;
    __dest = local_a8;
  }
  else {
    __dest = kj::_::HeapArrayDisposer::allocate<char>(count);
    local_d8.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    __n = digits->size_;
    local_d8.ptr = __dest;
    local_d8.size_ = count;
  }
  memcpy(__dest,digits->ptr,__n);
  pcVar2 = __dest + digits->size_;
  if ((fraction->ptr).isSet == true) {
    *pcVar2 = '.';
    memcpy(pcVar2 + 1,(fraction->ptr).field_1.value.ptr,(fraction->ptr).field_1.value.size_);
    pcVar2 = pcVar2 + 1 + (fraction->ptr).field_1.value.size_;
  }
  if ((exponent->ptr).isSet == true) {
    *pcVar2 = 'e';
    if ((exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.isSet
        == true) {
      *(anon_union_1_1_a8c68091_for_NullableValue<char>_2 *)(pcVar2 + 1) =
           (exponent->ptr).field_1.value.impl.super_TupleElement<0U,_kj::Maybe<char>_>.value.ptr.
           field_1;
      pcVar2 = pcVar2 + 2;
    }
    else {
      pcVar2 = pcVar2 + 1;
    }
    memcpy(pcVar2,*(void **)((long)&(exponent->ptr).field_1 + 8),
           *(size_t *)((long)&(exponent->ptr).field_1 + 0x10));
    pcVar2 = pcVar2 + *(long *)((long)&(exponent->ptr).field_1 + 0x10);
  }
  *pcVar2 = '\0';
  local_b8.content.ptr = __dest;
  local_b8.content.size_ = count;
  local_c0 = StringPtr::parseAs<double>(&local_b8);
  Array<char>::~Array(&local_d8);
  return local_c0;
}

Assistant:

double ParseFloat::operator()(const Array<char>& digits,
                              const Maybe<Array<char>>& fraction,
                              const Maybe<Tuple<Maybe<char>, Array<char>>>& exponent) const {
  size_t bufSize = digits.size();
  KJ_IF_SOME(f, fraction) {
    bufSize += 1 + f.size();
  }
  KJ_IF_SOME(e, exponent) {
    bufSize += 1 + (get<0>(e) != kj::none) + get<1>(e).size();
  }

  KJ_STACK_ARRAY(char, buf, bufSize + 1, 128, 128);

  char* pos = buf.begin();
  memcpy(pos, digits.begin(), digits.size());
  pos += digits.size();
  KJ_IF_SOME(f, fraction) {
    *pos++ = '.';
    memcpy(pos, f.begin(), f.size());
    pos += f.size();
  }
  KJ_IF_SOME(e, exponent) {
    *pos++ = 'e';
    KJ_IF_SOME(sign, get<0>(e)) {
      *pos++ = sign;
    }
    memcpy(pos, get<1>(e).begin(), get<1>(e).size());
    pos += get<1>(e).size();
  }

  *pos++ = '\0';
  KJ_DASSERT(pos == buf.end());

  // The above construction should always produce a valid double, so this should never throw...
  return StringPtr(buf.begin(), bufSize).parseAs<double>();
}